

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3-prov.c
# Opt level: O2

void * blake3_dupctx(void *vctx)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)blake3_newctx((void *)0x0);
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = *vctx;
    puVar1[1] = *(undefined8 *)((long)vctx + 8);
  }
  return puVar1;
}

Assistant:

static void *blake3_dupctx(void *vctx)
{
	struct blake3_ctx *src = vctx;
	struct blake3_ctx *dst = NULL;

	dst = blake3_newctx(NULL);

	if (dst == NULL) {
		return NULL;
	}

	dst->prov = src->prov;
	dst->out_len = src->out_len;

	return dst;
}